

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readValue(Reader *this)

{
  bool bVar1;
  ulong uVar2;
  Value *pVVar3;
  allocator<char> local_b1;
  string local_b0;
  Value local_90;
  Value local_78;
  Value local_50;
  byte local_31;
  undefined1 local_30 [7];
  bool successful;
  Token token;
  Reader *this_local;
  
  token.end_ = (Location)this;
  skipCommentTokens(this,(Token *)local_30);
  local_31 = 1;
  if (((this->collectComments_ & 1U) != 0) &&
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    pVVar3 = currentValue(this);
    Value::setComment(pVVar3,&this->commentsBefore_,commentBefore);
    std::__cxx11::string::operator=((string *)&this->commentsBefore_,anon_var_dwarf_103768 + 9);
  }
  switch(local_30._0_4_) {
  case 1:
    local_31 = readObject(this,(Token *)local_30);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Syntax error: value, object or array expected.",&local_b1);
    bVar1 = addError(this,&local_b0,(Token *)local_30,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    return bVar1;
  case 3:
    local_31 = readArray(this,(Token *)local_30);
    break;
  case 5:
    local_31 = decodeString(this,(Token *)local_30);
    break;
  case 6:
    local_31 = decodeNumber(this,(Token *)local_30);
    break;
  case 7:
    Value::Value(&local_50,true);
    pVVar3 = currentValue(this);
    Value::operator=(pVVar3,&local_50);
    Value::~Value(&local_50);
    break;
  case 8:
    Value::Value(&local_78,false);
    pVVar3 = currentValue(this);
    Value::operator=(pVVar3,&local_78);
    Value::~Value(&local_78);
    break;
  case 9:
    Value::Value(&local_90,nullValue);
    pVVar3 = currentValue(this);
    Value::operator=(pVVar3,&local_90);
    Value::~Value(&local_90);
  }
  if ((this->collectComments_ & 1U) != 0) {
    this->lastValueEnd_ = this->current_;
    pVVar3 = currentValue(this);
    this->lastValue_ = pVVar3;
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool
Reader::readValue()
{
   Token token;
   skipCommentTokens( token );
   bool successful = true;

   if ( collectComments_  &&  !commentsBefore_.empty() )
   {
      currentValue().setComment( commentsBefore_, commentBefore );
      commentsBefore_ = "";
   }


   switch ( token.type_ )
   {
   case tokenObjectBegin:
      successful = readObject( token );
      break;
   case tokenArrayBegin:
      successful = readArray( token );
      break;
   case tokenNumber:
      successful = decodeNumber( token );
      break;
   case tokenString:
      successful = decodeString( token );
      break;
   case tokenTrue:
      currentValue() = true;
      break;
   case tokenFalse:
      currentValue() = false;
      break;
   case tokenNull:
      currentValue() = Value();
      break;
   default:
      return addError( "Syntax error: value, object or array expected.", token );
   }

   if ( collectComments_ )
   {
      lastValueEnd_ = current_;
      lastValue_ = &currentValue();
   }

   return successful;
}